

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this;
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  reference this_00;
  undefined1 local_ac8 [8];
  Parser parser;
  ofstream out_file;
  undefined1 local_750 [8];
  VM_Writer vm_writer;
  string local_6f8 [8];
  ofstream vm_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  undefined1 local_4b8 [8];
  string str;
  const_iterator __end1;
  const_iterator __begin1;
  smatch *__range1;
  string vm_file_name;
  undefined1 local_458 [8];
  string rel_path;
  smatch smatch;
  regex regexp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  undefined1 local_3b8 [8];
  string file_path;
  undefined1 local_390 [4];
  int i;
  Tokenizer tokenizer;
  string local_250 [8];
  string exe_rel_path;
  long local_220;
  ifstream file;
  char **argv_local;
  int argc_local;
  
  std::ifstream::ifstream(&local_220);
  if (argc < 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Usage: jcomp <your_file.jack> (<your_file.jack>)*");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  pcVar1 = *argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_250,pcVar1,(allocator<char> *)(tokenizer.cur_token.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(tokenizer.cur_token.field_2._M_local_buf + 0xf));
  Tokenizer::Tokenizer((Tokenizer *)local_390,(ifstream *)&local_220);
  for (file_path.field_2._12_4_ = 1; (int)file_path.field_2._12_4_ < argc;
      file_path.field_2._12_4_ = file_path.field_2._12_4_ + 1) {
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)&local_3d8,(ulong)local_250);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8,
                   &local_3d8,argv[(int)file_path.field_2._12_4_]);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &regexp._M_automaton.
                    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,"Compiling file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8);
    poVar3 = std::operator<<((ostream *)&std::cout,
                             (string *)
                             &regexp._M_automaton.
                              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string
              ((string *)
               &regexp._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::ifstream::open((string *)&local_220,(_Ios_Openmode)local_3b8);
    Tokenizer::get_tokens((Tokenizer *)local_390);
    std::ios::clear((long)&local_220 + *(long *)(local_220 + -0x18),0);
    std::__cxx11::string::~string((string *)local_3b8);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&smatch._M_begin,
             "[A-Z]*[a-z]*.jack",0x10);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)((long)&rel_path.field_2 + 8));
  pcVar1 = argv[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_458,pcVar1,(allocator<char> *)(vm_file_name.field_2._M_local_buf + 0xf)
            );
  std::allocator<char>::~allocator((allocator<char> *)(vm_file_name.field_2._M_local_buf + 0xf));
  std::
  regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458,
             (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)((long)&rel_path.field_2 + 8),
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&smatch._M_begin,0);
  std::__cxx11::string::string((string *)&__range1);
  this = (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *)((long)&rel_path.field_2 + 8);
  __end1 = std::__cxx11::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::begin(this);
  str.field_2._8_8_ =
       std::__cxx11::
       match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ::end(this);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                *)((long)&str.field_2 + 8));
    if (!bVar2) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::operator*(&__end1);
    std::__cxx11::sub_match::operator_cast_to_string((string_type *)local_4b8,(sub_match *)this_00);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&local_4f8,(ulong)local_4b8);
    std::operator+(&local_4d8,&local_4f8,"vm");
    std::__cxx11::string::operator=((string *)&__range1,(string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::__cxx11::string::~string((string *)local_4b8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::operator++(&__end1);
  }
  std::ofstream::ofstream(local_6f8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &vm_writer.op_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 "/home/mke/projects/c++/jack_compiler/compiler/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1);
  std::ofstream::open(local_6f8,(int)&vm_writer + (_S_trunc|_S_out));
  std::__cxx11::string::~string
            ((string *)&vm_writer.op_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  VM_Writer::VM_Writer((VM_Writer *)local_750,(ofstream *)local_6f8);
  std::ofstream::ofstream
            (&parser.keyword_constant_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::ofstream::open((char *)&parser.keyword_constant_map._M_t._M_impl.super__Rb_tree_header.
                               _M_node_count,0x19d1fb);
  Parser::Parser((Parser *)local_ac8,
                 (ofstream *)
                 &parser.keyword_constant_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (Tokenizer *)local_390,(VM_Writer *)local_750);
  std::ifstream::close();
  std::ofstream::close();
  Parser::~Parser((Parser *)local_ac8);
  std::ofstream::~ofstream
            (&parser.keyword_constant_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  VM_Writer::~VM_Writer((VM_Writer *)local_750);
  std::ofstream::~ofstream(local_6f8);
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::string::~string((string *)local_458);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)((long)&rel_path.field_2 + 8));
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&smatch._M_begin);
  Tokenizer::~Tokenizer((Tokenizer *)local_390);
  std::__cxx11::string::~string(local_250);
  std::ifstream::~ifstream(&local_220);
  return 0;
}

Assistant:

int main(int argc, char** argv) {

    std::ifstream file;

    if (argc < 2) {
        std::cerr << "Usage: jcomp <your_file.jack> (<your_file.jack>)*" << std::endl;
        exit(0);
    }

    std::string exe_rel_path = argv[0];
    Tokenizer tokenizer(file);


    for (int i = 1; i < argc; i++) {
        std::string file_path =  exe_rel_path.substr(0, exe_rel_path.length() - 5) + argv[i];
        std::cout << "Compiling file: " + file_path << std::endl;
        file.open(file_path, std::ifstream::in);
        tokenizer.get_tokens();
        file.clear();
    }

    std::regex regexp("[A-Z]*[a-z]*.jack");
    std::smatch smatch;
    std::string rel_path = argv[1];
    std::regex_search(rel_path, smatch, regexp);

    std::string vm_file_name;
    for (std::string str : smatch) {
        vm_file_name = str.substr(0, str.size() - 4) + "vm";
    }

    std::ofstream vm_file;
    vm_file.open("/home/mke/projects/c++/jack_compiler/compiler/" + vm_file_name);
    VM_Writer vm_writer(vm_file);

    std::ofstream out_file;
    out_file.open("/home/mke/projects/c++/jack_compiler/compiler/syntax_struct.xml");

    Parser parser(out_file, tokenizer, vm_writer);

    file.close();
    out_file.close();

    return 0;
}